

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodemv.c
# Opt level: O0

int read_inter_segment_id(AV1_COMMON *cm,MACROBLOCKD *xd,int preskip,aom_reader *r)

{
  MB_MODE_INFO *pMVar1;
  byte bVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  int in_EDX;
  MACROBLOCKD *in_RSI;
  long in_RDI;
  aom_cdf_prob *pred_cdf;
  segmentation_probs *segp;
  FRAME_CONTEXT *ec_ctx;
  uint8_t ctx;
  int mi_stride;
  uint8_t segment_id;
  int y_mis;
  int x_mis;
  int bh;
  int bw;
  int mi_offset;
  int mi_col;
  int mi_row;
  MB_MODE_INFO *mbmi;
  CommonModeInfoParams *mi_params;
  segmentation *seg;
  uint skip;
  uint mi_offset_00;
  uint8_t segment_id_00;
  AV1_COMMON *in_stack_ffffffffffffff80;
  segmentation_probs *in_stack_ffffffffffffff88;
  FRAME_CONTEXT *in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  undefined4 in_stack_ffffffffffffffa0;
  uint skip_00;
  uint uVar8;
  int iVar9;
  uint local_4;
  
  pMVar1 = *in_RSI->mi;
  iVar7 = in_RSI->mi_row;
  iVar9 = in_RSI->mi_col;
  iVar3 = iVar7 * *(int *)(in_RDI + 0x218) + iVar9;
  uVar4 = (uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                [pMVar1->bsize];
  bVar2 = "\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
          [pMVar1->bsize];
  uVar5 = (uint)bVar2;
  mi_offset_00 = uVar4;
  if (*(int *)(in_RDI + 0x218) - iVar9 < (int)uVar4) {
    mi_offset_00 = *(int *)(in_RDI + 0x218) - iVar9;
  }
  skip = uVar5;
  if (*(int *)(in_RDI + 0x214) - iVar7 < (int)uVar5) {
    skip = *(int *)(in_RDI + 0x214) - iVar7;
  }
  if (*(char *)(in_RDI + 19000) == '\0') {
    local_4 = 0;
  }
  else if (*(char *)(in_RDI + 0x4a39) == '\0') {
    copy_segment_id((CommonModeInfoParams *)CONCAT44(skip,in_stack_ffffffffffffffa0),
                    (uint8_t *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                    (uint8_t *)in_stack_ffffffffffffff90,
                    (int)((ulong)in_stack_ffffffffffffff88 >> 0x20),(int)in_stack_ffffffffffffff88,
                    (int)((ulong)in_stack_ffffffffffffff80 >> 0x20));
    local_4 = get_predicted_segment_id(in_stack_ffffffffffffff80,mi_offset_00,skip,0);
  }
  else {
    if (in_EDX == 0) {
      if (pMVar1->skip_txfm != '\0') {
        if (*(char *)(in_RDI + 0x4a3b) != '\0') {
          *(ushort *)&pMVar1->field_0xa7 = *(ushort *)&pMVar1->field_0xa7 & 0xfff7;
        }
        iVar7 = read_segment_id((AV1_COMMON *)CONCAT44(iVar7,iVar9),
                                (MACROBLOCKD *)CONCAT44(iVar3,uVar4),
                                (aom_reader *)(ulong)CONCAT14(bVar2,mi_offset_00),skip);
        bVar2 = (byte)iVar7;
        set_segment_id((uint8_t *)in_stack_ffffffffffffff90,
                       (int)((ulong)in_stack_ffffffffffffff88 >> 0x20),
                       (int)in_stack_ffffffffffffff88,
                       (int)((ulong)in_stack_ffffffffffffff80 >> 0x20),
                       (int)in_stack_ffffffffffffff80,(uint8_t)(mi_offset_00 >> 0x18));
        return (uint)bVar2;
      }
    }
    else if (*(char *)(in_RDI + 0x4ae0) == '\0') {
      return 0;
    }
    if (*(char *)(in_RDI + 0x4a3b) == '\0') {
      iVar7 = read_segment_id((AV1_COMMON *)CONCAT44(iVar7,iVar9),
                              (MACROBLOCKD *)CONCAT44(iVar3,uVar4),
                              (aom_reader *)(ulong)CONCAT14(bVar2,mi_offset_00),skip);
      segment_id_00 = (uint8_t)(mi_offset_00 >> 0x18);
      bVar2 = (byte)iVar7;
    }
    else {
      skip_00 = skip;
      uVar8 = mi_offset_00;
      bVar2 = av1_get_pred_context_seg_id(in_RSI);
      in_stack_ffffffffffffff90 = in_RSI->tile_ctx;
      in_stack_ffffffffffffff88 = &in_stack_ffffffffffffff90->seg;
      in_stack_ffffffffffffff80 = (AV1_COMMON *)(in_stack_ffffffffffffff88->pred_cdf + bVar2);
      iVar6 = aom_read_symbol_((aom_reader *)in_stack_ffffffffffffff80,
                               (aom_cdf_prob *)CONCAT44(mi_offset_00,skip),0);
      *(ushort *)&pMVar1->field_0xa7 =
           *(ushort *)&pMVar1->field_0xa7 & 0xfff7 | ((byte)iVar6 & 1) << 3;
      if ((*(ushort *)&pMVar1->field_0xa7 >> 3 & 1) == 0) {
        iVar7 = read_segment_id((AV1_COMMON *)CONCAT44(iVar7,iVar9),
                                (MACROBLOCKD *)CONCAT44(iVar3,uVar4),
                                (aom_reader *)CONCAT44(uVar5,uVar8),skip_00);
        segment_id_00 = (uint8_t)(mi_offset_00 >> 0x18);
        bVar2 = (byte)iVar7;
      }
      else {
        iVar7 = get_predicted_segment_id(in_stack_ffffffffffffff80,mi_offset_00,skip,0);
        segment_id_00 = (uint8_t)(mi_offset_00 >> 0x18);
        bVar2 = (byte)iVar7;
      }
    }
    set_segment_id((uint8_t *)in_stack_ffffffffffffff90,
                   (int)((ulong)in_stack_ffffffffffffff88 >> 0x20),(int)in_stack_ffffffffffffff88,
                   (int)((ulong)in_stack_ffffffffffffff80 >> 0x20),(int)in_stack_ffffffffffffff80,
                   segment_id_00);
    local_4 = (uint)bVar2;
  }
  return local_4;
}

Assistant:

static int read_inter_segment_id(AV1_COMMON *const cm, MACROBLOCKD *const xd,
                                 int preskip, aom_reader *r) {
  struct segmentation *const seg = &cm->seg;
  const CommonModeInfoParams *const mi_params = &cm->mi_params;
  MB_MODE_INFO *const mbmi = xd->mi[0];
  const int mi_row = xd->mi_row;
  const int mi_col = xd->mi_col;
  const int mi_offset = mi_row * mi_params->mi_cols + mi_col;
  const int bw = mi_size_wide[mbmi->bsize];
  const int bh = mi_size_high[mbmi->bsize];

  // TODO(slavarnway): move x_mis, y_mis into xd ?????
  const int x_mis = AOMMIN(mi_params->mi_cols - mi_col, bw);
  const int y_mis = AOMMIN(mi_params->mi_rows - mi_row, bh);

  if (!seg->enabled) return 0;  // Default for disabled segmentation

  if (!seg->update_map) {
    copy_segment_id(mi_params, cm->last_frame_seg_map, cm->cur_frame->seg_map,
                    mi_offset, x_mis, y_mis);
    return get_predicted_segment_id(cm, mi_offset, x_mis, y_mis);
  }

  uint8_t segment_id;
  const int mi_stride = cm->mi_params.mi_cols;
  if (preskip) {
    if (!seg->segid_preskip) return 0;
  } else {
    if (mbmi->skip_txfm) {
      if (seg->temporal_update) {
        mbmi->seg_id_predicted = 0;
      }
      segment_id = read_segment_id(cm, xd, r, 1);
      set_segment_id(cm->cur_frame->seg_map, mi_offset, x_mis, y_mis, mi_stride,
                     segment_id);
      return segment_id;
    }
  }

  if (seg->temporal_update) {
    const uint8_t ctx = av1_get_pred_context_seg_id(xd);
    FRAME_CONTEXT *ec_ctx = xd->tile_ctx;
    struct segmentation_probs *const segp = &ec_ctx->seg;
    aom_cdf_prob *pred_cdf = segp->pred_cdf[ctx];
    mbmi->seg_id_predicted = aom_read_symbol(r, pred_cdf, 2, ACCT_STR);
    if (mbmi->seg_id_predicted) {
      segment_id = get_predicted_segment_id(cm, mi_offset, x_mis, y_mis);
    } else {
      segment_id = read_segment_id(cm, xd, r, 0);
    }
  } else {
    segment_id = read_segment_id(cm, xd, r, 0);
  }
  set_segment_id(cm->cur_frame->seg_map, mi_offset, x_mis, y_mis, mi_stride,
                 segment_id);
  return segment_id;
}